

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_utils.c
# Opt level: O3

char * apprun_shell_resolve_var_value(char **argv,char *var_name)

{
  char cVar1;
  uint uVar2;
  ushort **ppuVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  
  if (argv == (char **)0x0) {
    uVar6 = 0;
  }
  else {
    uVar2 = apprun_string_list_len(argv);
    uVar6 = (ulong)uVar2;
  }
  ppuVar3 = __ctype_b_loc();
  cVar1 = *var_name;
  uVar2 = (uint)(*ppuVar3)[cVar1];
  if (((*ppuVar3)[cVar1] >> 0xb & 1) != 0) {
    lVar4 = atol(var_name);
    if (lVar4 <= (long)uVar6) {
      pcVar5 = strdup(argv[lVar4]);
      goto LAB_00104fbf;
    }
  }
  pcVar5 = (char *)0x0;
LAB_00104fbf:
  if (((cVar1 == '@') && (argv != (char **)0x0)) && (var_name[1] == '\0')) {
    pcVar5 = apprun_argv_to_env(argv + 1);
    uVar2 = (uint)(*ppuVar3)[*var_name];
  }
  if ((uVar2 >> 10 & 1) != 0) {
    pcVar5 = getenv(var_name);
    if (pcVar5 != (char *)0x0) {
      pcVar5 = strdup(pcVar5);
      return pcVar5;
    }
    pcVar5 = (char *)0x0;
  }
  return pcVar5;
}

Assistant:

char *apprun_shell_resolve_var_value(char *const *argv, const char *var_name) {
    unsigned argc = 0;
    if (argv)
        argc = apprun_string_list_len(argv);

    char *var_value = NULL;
    if (isdigit(*var_name)) {
        long idx = atol(var_name);
        if (idx <= argc)
            var_value = strdup(argv[idx]);
    }

    if (strcmp(var_name, "@") == 0 && argv != NULL)
        var_value = apprun_argv_to_env(argv + 1);

    if (isalpha(*var_name)) {
        var_value = getenv(var_name);
        if (var_value)
            var_value = strdup(var_value);
    }


    return var_value;
}